

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf2.c
# Opt level: O0

void gf2MulTrinomial1(word *c,word *a,word *b,qr_o *f,void *stack)

{
  size_t in_RCX;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *in_R8;
  word *prod;
  void *in_stack_ffffffffffffffc8;
  
  ppMul(in_RSI,in_RDX,in_RCX,in_R8 + *(long *)(in_RCX + 0x30) * 2,(size_t)in_R8,
        in_stack_ffffffffffffffc8);
  gf2RedTrinomial1(in_R8,*(size_t *)(in_RCX + 0x30),*(gf2_trinom_st **)(in_RCX + 0x28));
  wwCopy(in_RDI,in_R8,*(size_t *)(in_RCX + 0x30));
  return;
}

Assistant:

static void gf2MulTrinomial1(word c[], const word a[], const word b[], 
	const qr_o* f, void* stack)
{
	word* prod = (word*)stack;
	stack = prod + 2 * f->n;
	ASSERT(gf2IsOperable(f));
	ASSERT(gf2IsIn(a, f));
	ASSERT(gf2IsIn(b, f));
	ppMul(prod, a, f->n, b, f->n, stack);
	gf2RedTrinomial1(prod, f->n, (const gf2_trinom_st*)f->params);
	wwCopy(c, prod, f->n);
}